

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<capnp::compiler::Compiler::Node_&> __thiscall
capnp::compiler::Compiler::Impl::lookupBuiltin(Impl *this,StringPtr name)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  key_type local_20;
  
  local_20.content.ptr = (char *)name.content.size_;
  iVar1 = std::
          _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
          ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                  *)(name.content.ptr + 0x220),&local_20);
  if (iVar1._M_node == (_Base_ptr)(name.content.ptr + 0x228)) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = iVar1._M_node[1]._M_right;
  }
  (this->super_LazyLoadCallback)._vptr_LazyLoadCallback = (_func_int **)p_Var2;
  return (Maybe<capnp::compiler::Compiler::Node_&>)(Node *)this;
}

Assistant:

kj::Maybe<Compiler::Node&> Compiler::Impl::lookupBuiltin(kj::StringPtr name) {
  auto iter = builtinDecls.find(name);
  if (iter == builtinDecls.end()) {
    return kj::none;
  } else {
    return *iter->second;
  }
}